

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_has(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue key_00;
  JSValue JVar1;
  void *pvVar2;
  JSMapRecord *pJVar3;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar4;
  JSValue key;
  JSMapRecord *mr;
  JSMapState *s;
  undefined8 uStackY_90;
  undefined8 in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  JVar4.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
  JVar4.u.ptr = in_stack_ffffffffffffff88.ptr;
  pvVar2 = JS_GetOpaque2(in_stack_ffffffffffffff80,JVar4,
                         (JSClassID)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (pvVar2 == (void *)0x0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    JVar4 = map_normalize_key(in_RDI,*in_R8);
    uStackY_90 = (JSMapState *)JVar4.tag;
    key_00.tag = (int64_t)pvVar2;
    key_00.u.ptr = in_stack_ffffffffffffff90.ptr;
    pJVar3 = map_find_record((JSContext *)in_stack_ffffffffffffff88.ptr,uStackY_90,key_00);
    local_30 = (uint)(pJVar3 != (JSMapRecord *)0x0);
    uStack_2c = uStack_c;
    local_28 = 1;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_map_has(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    return JS_NewBool(ctx, (mr != NULL));
}